

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::TestSpecParser::processNameChar(TestSpecParser *this,char c)

{
  bool bVar1;
  char c_local;
  TestSpecParser *this_local;
  
  if (c == '[') {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &this->m_substring,"exclude:");
    if (bVar1) {
      this->m_exclusion = true;
    }
    else {
      endMode(this);
    }
    startNewMode(this,Tag);
  }
  return;
}

Assistant:

void TestSpecParser::processNameChar( char c ) {
        if( c == '[' ) {
            if( m_substring == "exclude:" )
                m_exclusion = true;
            else
                endMode();
            startNewMode( Tag );
        }
    }